

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ValueBytes(sqlite3_value *pVal,u8 enc)

{
  u8 in_SIL;
  sqlite3_value *in_RDI;
  Mem *p;
  u8 in_stack_ffffffffffffffdf;
  int local_4;
  
  if (((in_RDI->flags & 2) == 0) || (in_RDI->enc != in_SIL)) {
    if (((in_RDI->flags & 2) == 0) || ((in_SIL == '\x01' || (in_RDI->enc == '\x01')))) {
      if ((in_RDI->flags & 0x10) == 0) {
        if ((in_RDI->flags & 1) == 0) {
          local_4 = valueBytes(in_RDI,in_stack_ffffffffffffffdf);
        }
        else {
          local_4 = 0;
        }
      }
      else if ((in_RDI->flags & 0x400) == 0) {
        local_4 = in_RDI->n;
      }
      else {
        local_4 = in_RDI->n + (in_RDI->u).nZero;
      }
    }
    else {
      local_4 = in_RDI->n;
    }
  }
  else {
    local_4 = in_RDI->n;
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3ValueBytes(sqlite3_value *pVal, u8 enc){
  Mem *p = (Mem*)pVal;
  assert( (p->flags & MEM_Null)==0 || (p->flags & (MEM_Str|MEM_Blob))==0 );
  if( (p->flags & MEM_Str)!=0 && pVal->enc==enc ){
    return p->n;
  }
  if( (p->flags & MEM_Str)!=0 && enc!=SQLITE_UTF8 && pVal->enc!=SQLITE_UTF8 ){
    return p->n;
  }
  if( (p->flags & MEM_Blob)!=0 ){
    if( p->flags & MEM_Zero ){
      return p->n + p->u.nZero;
    }else{
      return p->n;
    }
  }
  if( p->flags & MEM_Null ) return 0;
  return valueBytes(pVal, enc);
}